

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost2015_get_asn1_params
              (ASN1_TYPE *params,size_t ukm_size,uchar *iv,size_t ukm_offset,uchar *kdf_seed)

{
  int iVar1;
  GOST2015_CIPHER_PARAMS *a;
  uchar *p;
  uchar *local_38;
  
  local_38 = (uchar *)0x0;
  iv[0] = '\0';
  iv[1] = '\0';
  iv[2] = '\0';
  iv[3] = '\0';
  iv[4] = '\0';
  iv[5] = '\0';
  iv[6] = '\0';
  iv[7] = '\0';
  iv[8] = '\0';
  iv[9] = '\0';
  iv[10] = '\0';
  iv[0xb] = '\0';
  iv[0xc] = '\0';
  iv[0xd] = '\0';
  iv[0xe] = '\0';
  iv[0xf] = '\0';
  iVar1 = ASN1_TYPE_get((ASN1_TYPE *)params);
  if (iVar1 == 0x10) {
    local_38 = ((params->value).asn1_string)->data;
    a = d2i_GOST2015_CIPHER_PARAMS
                  ((GOST2015_CIPHER_PARAMS **)0x0,&local_38,
                   (long)((params->value).asn1_string)->length);
    if (a == (GOST2015_CIPHER_PARAMS *)0x0) {
      ERR_GOST_error(0x9e,0x6e,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                     ,0x48);
      return 0;
    }
    if (a->ukm->length == (int)ukm_size) {
      memcpy(iv,a->ukm->data,ukm_offset);
      *(undefined8 *)kdf_seed = *(undefined8 *)(a->ukm->data + ukm_offset);
      GOST2015_CIPHER_PARAMS_free(a);
      return 1;
    }
    ERR_GOST_error(0x9e,0x6e,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x4e);
    GOST2015_CIPHER_PARAMS_free(a);
  }
  else {
    ERR_GOST_error(0x9e,0x6e,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_gost2015.c"
                   ,0x40);
  }
  return 0;
}

Assistant:

int gost2015_get_asn1_params(const ASN1_TYPE *params, size_t ukm_size,
    unsigned char *iv, size_t ukm_offset, unsigned char *kdf_seed)
{
    int iv_len = 16;
    GOST2015_CIPHER_PARAMS *gcp = NULL;

    unsigned char *p = NULL;

    memset(iv, 0, iv_len);

    /* Проверяем тип params */
    if (ASN1_TYPE_get(params) != V_ASN1_SEQUENCE) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return 0;
    }

    p = params->value.sequence->data;
    /* Извлекаем структуру параметров */
    gcp = d2i_GOST2015_CIPHER_PARAMS(NULL, (const unsigned char **)&p, params->value.sequence->length);
    if (gcp == NULL) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        return 0;
    }

    /* Проверяем длину синхропосылки */
    if (gcp->ukm->length != (int)ukm_size) {
        GOSTerr(GOST_F_GOST2015_GET_ASN1_PARAMS, GOST_R_INVALID_CIPHER_PARAMS);
        GOST2015_CIPHER_PARAMS_free(gcp);
        return 0;
    }

    memcpy(iv, gcp->ukm->data, ukm_offset);
    memcpy(kdf_seed, gcp->ukm->data+ukm_offset, KDF_SEED_SIZE);

    GOST2015_CIPHER_PARAMS_free(gcp);
    return 1;
}